

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

bool __thiscall Pathie::Path::exists(Path *this)

{
  int val;
  int iVar1;
  int *piVar2;
  ErrnoError *this_00;
  string nstr;
  string local_38;
  
  utf8_to_filename(&local_38,&this->m_path);
  iVar1 = access(local_38._M_dataplus._M_p,0);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    val = *piVar2;
    if (val != 2) {
      this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
      ErrnoError::ErrnoError(this_00,val);
      __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return iVar1 != -1;
}

Assistant:

bool Path::exists() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  if (access(nstr.c_str(), F_OK) == -1) {
    int errsav = errno;
    if (errsav == ENOENT) {
      return false;
    }
    else {
      throw(Pathie::ErrnoError(errsav));
    }
  }
  else
    return true;
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(m_path);
  if (_waccess(utf16.c_str(), F_OK) == -1) {
    int errsav = errno;
    if (errsav == ENOENT) {
      return false;
    }
    else {
      throw(Pathie::ErrnoError(errsav));
    }
  }
  else
    return true;
#else
#error Unsupported system.
#endif
}